

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O0

void pzgeom::TPZQuadraticLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double qsi;
  int64_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  TPZFMatrix<double> *in_stack_ffffffffffffffd0;
  
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  *pdVar2 = (-dVar1 * (1.0 - dVar1)) / 2.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  *pdVar2 = (dVar1 * (dVar1 + 1.0)) / 2.0;
  col = (1.0 - dVar1) * (dVar1 + 1.0);
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int64_t)col);
  *pdVar2 = col;
  row = dVar1 - 0.5;
  pdVar2 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffffd0,(int64_t)row,(int64_t)col);
  *pdVar2 = row;
  this = (TPZFMatrix<double> *)(dVar1 + 0.5);
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar2 = (double)this;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar2 = dVar1 * -2.0;
  return;
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}